

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O2

void ear::dsp::LinearInterpVector::apply_interp
               (float **in,float **out,SampleIndex range_start,SampleIndex range_end,
               SampleIndex block_start,SampleIndex start,SampleIndex end,Point *start_point,
               Point *end_point)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  SampleIndex i;
  SampleIndex SVar6;
  long lVar7;
  float fVar8;
  
  pfVar3 = (start_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (start_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar5 = (end_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = 0; lVar7 != (long)pfVar4 - (long)pfVar3 >> 2; lVar7 = lVar7 + 1) {
    fVar1 = pfVar3[lVar7];
    fVar2 = pfVar5[lVar7];
    for (SVar6 = range_start; SVar6 < range_end; SVar6 = SVar6 + 1) {
      fVar8 = (float)((block_start - start) + SVar6) * (1.0 / (float)(end - start));
      out[lVar7][SVar6] = (fVar8 * fVar2 + (1.0 - fVar8) * fVar1) * (*in)[SVar6];
    }
  }
  return;
}

Assistant:

static void apply_interp(const float *const *in, float *const *out,
                               SampleIndex range_start, SampleIndex range_end,
                               SampleIndex block_start, SampleIndex start,
                               SampleIndex end, const Point &start_point,
                               const Point &end_point) {
        float scale = 1.0f / (end - start);

        for (size_t channel = 0; channel < start_point.size(); channel++) {
          float s = start_point[channel];
          float e = end_point[channel];

          for (SampleIndex i = range_start; i < range_end; i++) {
            float p = (float)((block_start + i) - start) * scale;
            float gain = (1.0f - p) * s + p * e;
            out[channel][i] = in[0][i] * gain;
          }
        }
      }